

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CConsole::CConsole(CConsole *this,int FlagMask)

{
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  uint size;
  CExecutionQueue *in_stack_ffffffffffffffc0;
  
  size = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  IConsole::IConsole((IConsole *)in_stack_ffffffffffffffc0);
  *in_RDI = (long)&PTR__CConsole_001851b0;
  CHeap::CHeap((CHeap *)0x13d45d);
  CExecutionQueue::CExecutionQueue((CExecutionQueue *)0x13d475);
  *(undefined4 *)(in_RDI + 2) = in_ESI;
  *(undefined4 *)(in_RDI + 9) = 0;
  in_RDI[10] = 0;
  CHeap::Reset(&in_stack_ffffffffffffffc0->m_Queue);
  *(undefined1 *)((long)in_RDI + 0x14) = 1;
  in_RDI[3] = (long)"0";
  in_RDI[4] = (long)"1";
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  CExecutionQueue::Reset(in_stack_ffffffffffffffc0);
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  mem_zero(in_stack_ffffffffffffffc0,size);
  *(undefined4 *)(in_RDI + 0x18) = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  (**(code **)(*in_RDI + 0x40))(in_RDI,"echo","r[text]",6,Con_Echo,in_RDI,"Echo the text");
  (**(code **)(*in_RDI + 0x40))
            (in_RDI,"exec","r[file]",6,Con_Exec,in_RDI,"Execute the specified file");
  (**(code **)(*in_RDI + 0x40))
            (in_RDI,"eval_if","s[config] s[comparison] s[value] s[command] ?s[else] ?s[command]",0xe
             ,Con_EvalIf,in_RDI,"Execute command if condition is true");
  (**(code **)(*in_RDI + 0x40))
            (in_RDI,"toggle","s[config-option] i[value1] i[value2]",6,ConToggle,in_RDI,
             "Toggle config value");
  (**(code **)(*in_RDI + 0x40))
            (in_RDI,"+toggle","s[config-option] i[value1] i[value2]",2,ConToggleStroke,in_RDI,
             "Toggle config value via keypress");
  (**(code **)(*in_RDI + 0x40))
            (in_RDI,"mod_command","s[command] ?i[access-level]",4,ConModCommandAccess,in_RDI,
             "Specify command accessibility for moderators");
  (**(code **)(*in_RDI + 0x40))
            (in_RDI,"mod_status","",4,ConModCommandStatus,in_RDI,
             "List all commands which are accessible for moderators");
  return;
}

Assistant:

CConsole::CConsole(int FlagMask)
{
	m_FlagMask = FlagMask;
	m_AccessLevel = ACCESS_LEVEL_ADMIN;
	m_pRecycleList = 0;
	m_TempCommands.Reset();
	m_StoreCommands = true;
	m_paStrokeStr[0] = "0";
	m_paStrokeStr[1] = "1";
	m_pTempMapListHeap = 0;
	m_pFirstMapEntry = 0;
	m_pLastMapEntry = 0;
	m_ExecutionQueue.Reset();
	m_pFirstCommand = 0;
	m_pFirstExec = 0;
	mem_zero(m_aPrintCB, sizeof(m_aPrintCB));
	m_NumPrintCB = 0;

	m_pConfig = 0;
	m_pStorage = 0;

	// register some basic commands
	Register("echo", "r[text]", CFGFLAG_SERVER|CFGFLAG_CLIENT, Con_Echo, this, "Echo the text");
	Register("exec", "r[file]", CFGFLAG_SERVER|CFGFLAG_CLIENT, Con_Exec, this, "Execute the specified file");
	Register("eval_if", "s[config] s[comparison] s[value] s[command] ?s[else] ?s[command]", CFGFLAG_SERVER|CFGFLAG_CLIENT|CFGFLAG_STORE, Con_EvalIf, this, "Execute command if condition is true");

	Register("toggle", "s[config-option] i[value1] i[value2]", CFGFLAG_SERVER|CFGFLAG_CLIENT, ConToggle, this, "Toggle config value");
	Register("+toggle", "s[config-option] i[value1] i[value2]", CFGFLAG_CLIENT, ConToggleStroke, this, "Toggle config value via keypress");

	Register("mod_command", "s[command] ?i[access-level]", CFGFLAG_SERVER, ConModCommandAccess, this, "Specify command accessibility for moderators");
	Register("mod_status", "", CFGFLAG_SERVER, ConModCommandStatus, this, "List all commands which are accessible for moderators");
}